

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O0

float __thiscall
deqp::gles2::Performance::anon_unknown_1::OperatorPerformanceCase::WorkloadRecord::getMedianTime
          (WorkloadRecord *this)

{
  float fVar1;
  iterator __first;
  iterator __last;
  size_type sVar2;
  reference pvVar3;
  value_type local_54;
  undefined1 local_28 [8];
  vector<float,_std::allocator<float>_> times;
  WorkloadRecord *this_local;
  
  times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_28,&this->frameTimes);
  __first = std::vector<float,_std::allocator<float>_>::begin
                      ((vector<float,_std::allocator<float>_> *)local_28);
  __last = std::vector<float,_std::allocator<float>_>::end
                     ((vector<float,_std::allocator<float>_> *)local_28);
  std::sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             __first._M_current,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             __last._M_current);
  sVar2 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_28);
  if ((sVar2 & 1) == 0) {
    sVar2 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_28);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_28,(sVar2 >> 1) - 1);
    fVar1 = *pvVar3;
    sVar2 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_28);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_28,sVar2 >> 1);
    local_54 = (fVar1 + *pvVar3) * 0.5;
  }
  else {
    sVar2 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)local_28);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_28,sVar2 >> 1);
    local_54 = *pvVar3;
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_28);
  return local_54;
}

Assistant:

float	getMedianTime	(void) const
		{
			vector<float> times = frameTimes;
			std::sort(times.begin(), times.end());
			return times.size() % 2 == 0 ?
					(times[times.size()/2-1] + times[times.size()/2])*0.5f :
					times[times.size()/2];
		}